

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::fill_line_buffer(lexer *this,size_t n)

{
  string_t *psVar1;
  size_type sVar2;
  lexer_char_t *plVar3;
  lexer_char_t *plVar4;
  lexer_char_t *plVar5;
  istream *piVar6;
  pointer pcVar7;
  lexer_char_t *plVar8;
  long lVar9;
  
  sVar2 = (this->m_line_buffer)._M_string_length;
  if (sVar2 != 0) {
    if (this->m_content != (lexer_char_t *)(this->m_line_buffer)._M_dataplus._M_p) {
      __assert_fail("m_line_buffer.empty() or m_content == reinterpret_cast<const lexer_char_t*>(m_line_buffer.data())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a65,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    if ((sVar2 != 0) && (this->m_limit != this->m_content + sVar2)) {
      __assert_fail("m_line_buffer.empty() or m_limit == m_content + m_line_buffer.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a69,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
  }
  plVar3 = this->m_start;
  if (plVar3 < this->m_content) {
    __assert_fail("m_content <= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6c,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  plVar4 = this->m_cursor;
  if (plVar3 <= plVar4) {
    if (this->m_limit < plVar4) {
      __assert_fail("m_cursor <= m_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a6e,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    plVar5 = this->m_marker;
    if (plVar5 <= this->m_limit) {
      psVar1 = &this->m_line_buffer;
      piVar6 = this->m_stream;
      if ((piVar6 == (istream *)0x0) ||
         (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 2) != 0)) {
        pcVar7 = (this->m_line_buffer)._M_dataplus._M_p;
        std::__cxx11::string::_M_replace_dispatch<unsigned_char_const*>
                  ((string *)psVar1,pcVar7,pcVar7 + sVar2,plVar3);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)psVar1,(this->m_line_buffer)._M_string_length,0,'\x01');
        if (n != 0) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)psVar1,(this->m_line_buffer)._M_string_length,0,(char)n + -1);
        }
      }
      else {
        std::__cxx11::string::erase((ulong)psVar1,0);
        (this->m_line_buffer_tmp)._M_string_length = 0;
        *(this->m_line_buffer_tmp)._M_dataplus._M_p = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (this->m_stream,(string *)&this->m_line_buffer_tmp,'\n');
        std::__cxx11::string::_M_append
                  ((char *)psVar1,(ulong)(this->m_line_buffer_tmp)._M_dataplus._M_p);
        std::__cxx11::string::push_back((char)psVar1);
      }
      plVar8 = (lexer_char_t *)(this->m_line_buffer)._M_dataplus._M_p;
      this->m_content = plVar8;
      if (plVar8 != (lexer_char_t *)0x0) {
        lVar9 = (long)plVar5 - (long)plVar3;
        if (plVar5 == (lexer_char_t *)0x0) {
          lVar9 = 0;
        }
        this->m_start = plVar8;
        this->m_marker = plVar8 + lVar9;
        this->m_cursor = plVar8 + ((long)plVar4 - (long)plVar3);
        this->m_limit = plVar8 + (this->m_line_buffer)._M_string_length;
        return;
      }
      __assert_fail("m_content != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a97,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    __assert_fail("m_marker == nullptr or m_marker <= m_limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6f,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  __assert_fail("m_start <= m_cursor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                ,0x2a6d,
                "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
               );
}

Assistant:

void fill_line_buffer(size_t n = 0)
        {
            // if line buffer is used, m_content points to its data
            assert(m_line_buffer.empty()
                   or m_content == reinterpret_cast<const lexer_char_t*>(m_line_buffer.data()));

            // if line buffer is used, m_limit is set past the end of its data
            assert(m_line_buffer.empty()
                   or m_limit == m_content + m_line_buffer.size());

            // pointer relationships
            assert(m_content <= m_start);
            assert(m_start <= m_cursor);
            assert(m_cursor <= m_limit);
            assert(m_marker == nullptr or m_marker  <= m_limit);

            // number of processed characters (p)
            const auto num_processed_chars = static_cast<size_t>(m_start - m_content);
            // offset for m_marker wrt. to m_start
            const auto offset_marker = (m_marker == nullptr) ? 0 : m_marker - m_start;
            // number of unprocessed characters (u)
            const auto offset_cursor = m_cursor - m_start;

            // no stream is used or end of file is reached
            if (m_stream == nullptr or m_stream->eof())
            {
                // m_start may or may not be pointing into m_line_buffer at
                // this point. We trust the standard library to do the right
                // thing. See http://stackoverflow.com/q/28142011/266378
                m_line_buffer.assign(m_start, m_limit);

                // append n characters to make sure that there is sufficient
                // space between m_cursor and m_limit
                m_line_buffer.append(1, '\x00');
                if (n > 0)
                {
                    m_line_buffer.append(n - 1, '\x01');
                }
            }
            else
            {
                // delete processed characters from line buffer
                m_line_buffer.erase(0, num_processed_chars);
                // read next line from input stream
                m_line_buffer_tmp.clear();
                std::getline(*m_stream, m_line_buffer_tmp, '\n');

                // add line with newline symbol to the line buffer
                m_line_buffer += m_line_buffer_tmp;
                m_line_buffer.push_back('\n');
            }

            // set pointers
            m_content = reinterpret_cast<const lexer_char_t*>(m_line_buffer.data());
            assert(m_content != nullptr);
            m_start  = m_content;
            m_marker = m_start + offset_marker;
            m_cursor = m_start + offset_cursor;
            m_limit  = m_start + m_line_buffer.size();
        }